

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_sectors.cxx
# Opt level: O0

void __thiscall
xray_re::xr_level_sectors::load(xr_level_sectors *this,uint32_t xrlc_version,xr_reader *r)

{
  xr_reader *r_00;
  xr_reader *s_1;
  xr_reader *s;
  xr_reader *r_local;
  xr_level_sectors *pxStack_10;
  uint32_t xrlc_version_local;
  xr_level_sectors *this_local;
  
  s_1 = (xr_reader *)0x0;
  s = r;
  r_local._4_4_ = xrlc_version;
  pxStack_10 = this;
  if (xrlc_version < 10) {
    if (xrlc_version == 5) {
      s_1 = xr_reader::open_chunk(r,0xb);
    }
    else {
      s_1 = xr_reader::open_chunk(r,10);
    }
    if (s_1 == (xr_reader *)0x0) {
      __assert_fail("s",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_sectors.cxx"
                    ,0x35,"void xray_re::xr_level_sectors::load(uint32_t, xr_reader &)");
    }
    load_v5(this,s_1);
  }
  else {
    r_00 = xr_reader::open_chunk(r,8);
    if (r_00 == (xr_reader *)0x0) {
      __assert_fail("s",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_sectors.cxx"
                    ,0x39,"void xray_re::xr_level_sectors::load(uint32_t, xr_reader &)");
    }
    load_v13(this,r_00);
  }
  xr_reader::close_chunk(s,&s_1);
  return;
}

Assistant:

void xr_level_sectors::load(uint32_t xrlc_version, xr_reader& r)
{
	xr_reader* s = 0;
	if (xrlc_version <= XRLC_VERSION_9) {
		if (xrlc_version == XRLC_VERSION_5)
			s = r.open_chunk(FSL5_SECTORS);
		else
			s = r.open_chunk(FSL8_SECTORS);
		xr_assert(s);
		load_v5(*s);
	} else {
		xr_reader* s = r.open_chunk(FSL13_SECTORS);
		xr_assert(s);
		load_v13(*s);
	}
	r.close_chunk(s);
}